

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O3

void test_2d_dynamic<5ul,5ul,30ul,30ul>(void)

{
  int *t;
  undefined8 uVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  char *local_70;
  char *local_68;
  char *local_60;
  vector<int,_std::allocator<int>_> local_58;
  long local_40;
  pointer local_38;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_60 = (char *)CONCAT71(local_60._1_7_,1);
  pcVar4 = "void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]";
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x76,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",(bool *)&local_58
             ,(bool *)&local_60);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_60._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x78,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)&local_58,(int *)&local_60);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_60 = (char *)CONCAT44(local_60._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x79,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)&local_58,(int *)&local_60);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x384;
  local_60 = (char *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x7b,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)&local_58,(unsigned_long *)&local_60);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000004c9;
  local_60 = (char *)0x4c9;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x7c,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)&local_58,(unsigned_long *)&local_60);
  local_60 = (char *)CONCAT44(local_60._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_58,0x4c9,(value_type_conflict1 *)&local_60,(allocator_type *)&local_70);
  lVar5 = 0;
  local_38 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  pcVar2 = (char *)0x0;
  do {
    uVar3 = 0;
    local_68 = pcVar2;
    local_40 = lVar5;
    do {
      local_70 = pcVar2;
      local_60 = pcVar2;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x8a,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_70,(unsigned_long *)&local_60);
      if (uVar3 < 0x1e) {
        if ((char *)0x1d < local_68) {
          *(undefined4 *)((long)local_38 + lVar5) = 0x18;
          local_70._0_4_ = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x9c,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                     (int *)((long)local_38 + lVar5),(int *)&local_70);
          if ((char *)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) <= pcVar2) goto LAB_00106ef6;
          local_70 = (char *)CONCAT44(local_70._4_4_,0x18);
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x9f,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                     (int *)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar5),(int *)&local_70);
        }
      }
      else {
        *(undefined4 *)((long)local_38 + lVar5) = 0x11;
        local_70._0_4_ = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x91,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                   (int *)((long)local_38 + lVar5),(int *)&local_70);
        if ((char *)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2) <= pcVar2) {
LAB_00106ef6:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pcVar2);
          goto LAB_00106f07;
        }
        local_70 = (char *)CONCAT44(local_70._4_4_,0x11);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x94,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                   (int *)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar5),(int *)&local_70);
      }
      uVar3 = uVar3 + 1;
      pcVar2 = pcVar2 + 0x23;
      lVar5 = lVar5 + 0x8c;
    } while (uVar3 != 0x23);
    pcVar2 = local_68 + 1;
    lVar5 = local_40 + 4;
  } while (pcVar2 != (char *)0x23);
  lVar5 = 0;
  pcVar4 = (char *)0x0;
  do {
    uVar3 = 0;
    local_68 = pcVar4;
    local_40 = lVar5;
    do {
      local_70 = pcVar4;
      local_60 = pcVar4;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0xa9,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_70,(unsigned_long *)&local_60);
      t = (int *)((long)local_38 + lVar5);
      if (uVar3 < 0x1e) {
        if (local_68 < (char *)0x1e) {
          local_70 = (char *)CONCAT44(local_70._4_4_,0x2a);
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","42",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0xc0,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",t,
                     (int *)&local_70);
        }
        else {
          local_70._0_4_ = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0xb7,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",t,
                     (int *)&local_70);
          if ((char *)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) <= pcVar4) goto LAB_00106f07;
          local_70 = (char *)CONCAT44(local_70._4_4_,0x18);
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0xba,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                     (int *)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar5),(int *)&local_70);
        }
      }
      else {
        local_70._0_4_ = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0xae,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",t,
                   (int *)&local_70);
        if ((char *)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2) <= pcVar4) {
LAB_00106f07:
          uVar1 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,pcVar4);
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar1);
        }
        local_70 = (char *)CONCAT44(local_70._4_4_,0x11);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0xb1,"void test_2d_dynamic() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                   (int *)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar5),(int *)&local_70);
      }
      uVar3 = uVar3 + 1;
      pcVar4 = pcVar4 + 0x23;
      lVar5 = lVar5 + 0x8c;
    } while (uVar3 != 0x23);
    pcVar4 = local_68 + 1;
    lVar5 = local_40 + 4;
    if (pcVar4 == (char *)0x23) {
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn>, dimensions<1, 1>, dimensions<dyn, dyn>
    > const l{{X, Y}, {}, {N, M}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.padding()[0]) * (l[1] + l.padding()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}